

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

int __thiscall
ADPlanner::replan(ADPlanner *this,vector<int,_std::allocator<int>_> *solution_stateIDs_V,
                 ReplanParams params,int *solcost)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_stack_00000018;
  
  in_RDI[2] = (long)solution_stateIDs_V;
  in_RDI[7] = (long)this;
  in_RDI[6] = in_stack_00000018;
  *(byte *)((long)in_RDI + 0x71) = params.initial_eps._0_1_ & 1;
  *(bool *)(in_RDI + 9) = 0.0 < params.dec_eps;
  in_RDI[8] = (long)params.dec_eps;
  iVar1 = (**(code **)(*in_RDI + 8))(params.final_eps,in_RDI,in_RSI,in_RDX);
  return iVar1;
}

Assistant:

int ADPlanner::replan(vector<int>* solution_stateIDs_V, ReplanParams params, int* solcost)
{
    finitial_eps = params.initial_eps;
    final_epsilon = params.final_eps;
    dec_eps = params.dec_eps;
    bsearchuntilfirstsolution = params.return_first_solution;
    use_repair_time = params.repair_time > 0;
    repair_time = params.repair_time;
    return replan(params.max_time, solution_stateIDs_V, solcost);
}